

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::DeepTiledInputFile::~DeepTiledInputFile(DeepTiledInputFile *this)

{
  long lVar1;
  _func_int **pp_Var2;
  size_type sVar3;
  reference ppTVar4;
  GenericInputFile *in_RDI;
  Data *in_stack_00000010;
  size_t i;
  ulong local_10;
  
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__DeepTiledInputFile_00562a78;
  if (((ulong)in_RDI[1]._vptr_GenericInputFile[0x31] & 1) == 0) {
    for (local_10 = 0;
        sVar3 = std::
                vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ::size((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                        *)(in_RDI[1]._vptr_GenericInputFile + 0x2e)), local_10 < sVar3;
        local_10 = local_10 + 1) {
      ppTVar4 = std::
                vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                              *)(in_RDI[1]._vptr_GenericInputFile + 0x2e),local_10);
      lVar1._0_4_ = (*ppTVar4)->format;
      lVar1._4_4_ = (*ppTVar4)->dx;
      if (lVar1 != 0) {
        ppTVar4 = std::
                  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                  ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                *)(in_RDI[1]._vptr_GenericInputFile + 0x2e),local_10);
        if (*(void **)&(*ppTVar4)->format != (void *)0x0) {
          operator_delete__(*(void **)&(*ppTVar4)->format);
        }
      }
    }
  }
  if ((((ulong)in_RDI[1]._vptr_GenericInputFile[0x3c] & 1) != 0) &&
     (*(long **)(in_RDI[1]._vptr_GenericInputFile[0x3b] + 0x28) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI[1]._vptr_GenericInputFile[0x3b] + 0x28) + 8))();
  }
  if ((*(int *)(in_RDI[1]._vptr_GenericInputFile + 0x2b) == -1) &&
     (in_RDI[1]._vptr_GenericInputFile[0x3b] != (_func_int *)0x0)) {
    operator_delete(in_RDI[1]._vptr_GenericInputFile[0x3b],0x38);
  }
  pp_Var2 = in_RDI[1]._vptr_GenericInputFile;
  if (pp_Var2 != (_func_int **)0x0) {
    Data::~Data(in_stack_00000010);
    operator_delete(pp_Var2,0x1e8);
  }
  GenericInputFile::~GenericInputFile(in_RDI);
  return;
}

Assistant:

DeepTiledInputFile::~DeepTiledInputFile ()
{
    if (!_data->memoryMapped)
        for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            if (_data->tileBuffers[i]->buffer != 0)
                delete [] _data->tileBuffers[i]->buffer;

    if (_data->_deleteStream)
        delete _data->_streamData->is;

    //
    // (TODO) we should have a way to tell if the stream data is owned by this file or
    // by a parent multipart file.
    //

    if (_data->partNumber == -1)
        delete _data->_streamData;

    delete _data;
}